

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaFacetPtr xmlSchemaNewFacet(void)

{
  xmlSchemaFacetPtr ret;
  
  ret = (xmlSchemaFacetPtr)(*xmlMalloc)(0x48);
  if (ret == (xmlSchemaFacetPtr)0x0) {
    ret = (xmlSchemaFacetPtr)0x0;
  }
  else {
    memset(ret,0,0x48);
  }
  return ret;
}

Assistant:

xmlSchemaFacetPtr
xmlSchemaNewFacet(void)
{
    xmlSchemaFacetPtr ret;

    ret = (xmlSchemaFacetPtr) xmlMalloc(sizeof(xmlSchemaFacet));
    if (ret == NULL) {
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaFacet));

    return (ret);
}